

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

bool rgbcx::unpack_bc3(void *pBlock_bits,void *pPixels,bc1_approx_mode mode)

{
  bool success;
  uint32_t unaff_retaddr;
  color32 *pDst_pixels;
  undefined4 in_stack_00000010;
  bc1_approx_mode in_stack_00000110;
  bool in_stack_00000117;
  void *in_stack_00000118;
  void *in_stack_00000120;
  bool local_21;
  
  local_21 = unpack_bc1(in_stack_00000120,in_stack_00000118,in_stack_00000117,in_stack_00000110);
  local_21 = !local_21;
  unpack_bc4((void *)CONCAT44(mode,in_stack_00000010),(uint8_t *)pDst_pixels,unaff_retaddr);
  return local_21;
}

Assistant:

bool unpack_bc3(const void* pBlock_bits, void* pPixels, bc1_approx_mode mode)
	{
		color32* pDst_pixels = static_cast<color32*>(pPixels);

		bool success = true;

		if (unpack_bc1((const uint8_t*)pBlock_bits + sizeof(bc4_block), pDst_pixels, true, mode))
			success = false;

		unpack_bc4(pBlock_bits, &pDst_pixels[0].a, sizeof(color32));

		return success;
	}